

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

bool __thiscall
QXmlStreamReaderPrivate::scanUntil(QXmlStreamReaderPrivate *this,char *str,short tokenToInject)

{
  QString *this_00;
  qsizetype from;
  qint64 qVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long in_FS_OFFSET;
  QStringView s;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->textBuffer;
  from = (this->textBuffer).d.size;
  qVar1 = this->lineNumber;
  do {
    while( true ) {
      lVar4 = (this->putStack).tos;
      if (lVar4 == -1) {
        lVar4 = this->readBufferPos;
        if (lVar4 < (this->readBuffer).d.size) {
          this->readBufferPos = lVar4 + 1;
          uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[lVar4];
        }
        else {
          uVar7 = getChar_helper(this);
        }
      }
      else {
        uVar7 = 0xffffffff;
        if (this->atEnd == false) {
          uVar7 = (this->putStack).data[lVar4];
          (this->putStack).tos = lVar4 + -1;
        }
      }
      if (9 < (int)uVar7) break;
      if (uVar7 != 9) {
        if (uVar7 != 0xffffffff) goto LAB_0039cdda;
        s.m_data = (this->textBuffer).d.ptr;
        s.m_size = (this->textBuffer).d.size;
        putString(this,s,from);
        QString::resize(this_00,from);
LAB_0039cfef:
        this->lineNumber = qVar1;
        bVar3 = false;
        goto LAB_0039cffd;
      }
LAB_0039cf4e:
      QString::append(this_00,(QChar)(char16_t)uVar7);
    }
    if (uVar7 == 10) {
      uVar6 = 10;
LAB_0039cf30:
      uVar7 = uVar6;
      this->lineNumber = this->lineNumber + 1;
      this->lastLineStart = this->readBufferPos + this->characterOffset;
      goto LAB_0039cf4e;
    }
    if (uVar7 == 0xd) {
      lVar4 = (this->putStack).tos;
      if (lVar4 == -1) {
        if (this->readBufferPos < (this->readBuffer).d.size) {
          uVar7 = (uint)(ushort)(this->readBuffer).d.ptr[this->readBufferPos];
        }
        else {
          uVar7 = getChar_helper(this);
          if (uVar7 == 0xffffffff) {
            uVar7 = 0xffffffff;
          }
          else {
            this->readBufferPos = this->readBufferPos + -1;
          }
        }
      }
      else {
        uVar7 = (this->putStack).data[lVar4];
      }
      if (uVar7 != 0xffffffff) {
        uVar6 = 10;
        if (uVar7 == 10) {
          lVar4 = (this->putStack).tos;
          if (lVar4 == -1) {
            this->readBufferPos = this->readBufferPos + 1;
          }
          else {
            (this->putStack).tos = lVar4 + -1;
          }
        }
        bVar3 = false;
LAB_0039cef5:
        uVar7 = 0;
        if (!bVar3) goto LAB_0039cf30;
        goto LAB_0039cefb;
      }
      lVar4 = (this->putStack).tos;
      lVar2 = (this->putStack).cap;
      if (lVar4 + 1 < lVar2) {
LAB_0039cec5:
        lVar4 = (this->putStack).tos;
        (this->putStack).tos = lVar4 + 1;
        (this->putStack).data[lVar4 + 1] = 0xd;
        uVar6 = 0;
        bVar3 = true;
        goto LAB_0039cef5;
      }
      lVar4 = lVar4 + 2;
      lVar8 = lVar2 * 2;
      if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == lVar4 + lVar2 * -2 < 0) {
        lVar8 = lVar4;
      }
      (this->putStack).cap = lVar8;
      puVar5 = (uint *)realloc((this->putStack).data,lVar8 << 2);
      (this->putStack).data = puVar5;
      if (puVar5 != (uint *)0x0) goto LAB_0039cec5;
LAB_0039d0a7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_0039d0bc;
    }
LAB_0039cdda:
    if (((uVar7 < 0x20) || (0x10ffff < uVar7)) || ((uVar7 & 0xfffffffe) == 0xfffe)) {
      QCoreApplication::translate(&local_50,"QXmlStream","Invalid XML character.",(char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,&local_50);
      this->type = Invalid;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      goto LAB_0039cfef;
    }
    QString::append(this_00,(QChar)(char16_t)uVar7);
LAB_0039cefb:
    if (uVar7 == (int)*str) {
      if (str[1] == '\0') {
        bVar3 = true;
        if (-1 < tokenToInject) {
          lVar4 = (this->putStack).tos;
          lVar2 = (this->putStack).cap;
          if (lVar2 <= lVar4 + 1) {
            lVar4 = lVar4 + 2;
            lVar8 = lVar2 * 2;
            if (lVar4 != lVar8 && SBORROW8(lVar4,lVar8) == lVar4 + lVar2 * -2 < 0) {
              lVar8 = lVar4;
            }
            (this->putStack).cap = lVar8;
            puVar5 = (uint *)realloc((this->putStack).data,lVar8 << 2);
            (this->putStack).data = puVar5;
            if (puVar5 == (uint *)0x0) goto LAB_0039d0a7;
          }
          lVar4 = (this->putStack).tos;
          (this->putStack).tos = lVar4 + 1;
          (this->putStack).data[lVar4 + 1] = (uint)(ushort)tokenToInject << 0x10;
        }
        goto LAB_0039cffd;
      }
      bVar3 = scanString(this,str + 1,tokenToInject,false);
      if (bVar3) break;
    }
  } while( true );
  bVar3 = true;
LAB_0039cffd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
LAB_0039d0bc:
  __stack_chk_fail();
}

Assistant:

bool QXmlStreamReaderPrivate::scanUntil(const char *str, short tokenToInject)
{
    const qsizetype pos = textBuffer.size();
    const auto oldLineNumber = lineNumber;

    uint c;
    while ((c = getChar()) != StreamEOF) {
        /* First, we do the validation & normalization. */
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                break;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case '\t':
            textBuffer += QChar(c);
            continue;
        default:
            if (c < 0x20 || (c > 0xFFFD && c < 0x10000) || c > QChar::LastValidCodePoint ) {
                raiseWellFormedError(QXmlStream::tr("Invalid XML character."));
                lineNumber = oldLineNumber;
                return false;
            }
            textBuffer += QChar(c);
        }


        /* Second, attempt to lookup str. */
        if (c == uint(*str)) {
            if (!*(str + 1)) {
                if (tokenToInject >= 0)
                    injectToken(tokenToInject);
                return true;
            } else {
                if (scanString(str + 1, tokenToInject, false))
                    return true;
            }
        }
    }
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    lineNumber = oldLineNumber;
    return false;
}